

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAttach.c
# Opt level: O3

int Abc_NtkAttach(Abc_Ntk_t *pNtk)

{
  size_t __size;
  Abc_Obj_t *pObj;
  byte *pSop;
  int *piVar1;
  void **ppvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  Mio_Gate_t **ppMVar6;
  long *__ptr;
  void *pvVar7;
  Mio_Gate_t *pMVar8;
  ulong uVar9;
  Vec_Ptr_t *pVVar10;
  uint uVar11;
  long lVar12;
  byte *pbVar13;
  ulong uVar14;
  Mio_Library_t *pLib;
  uint uVar15;
  byte bVar16;
  long lVar17;
  char *pcVar18;
  char *__format;
  ulong uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int nGates;
  uint uTruths [6] [2];
  int Perm [10];
  int pTempInts [10];
  uint local_f4;
  Mio_Gate_t **local_f0;
  undefined8 local_e8;
  Abc_Ntk_t *local_e0;
  Mio_Library_t *local_d8;
  uint local_d0 [6];
  undefined8 local_b8;
  ulong local_b0 [4];
  undefined8 local_90;
  int aiStack_88 [12];
  int aiStack_58 [10];
  
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcAttach.c"
                  ,0x45,"int Abc_NtkAttach(Abc_Ntk_t *)");
  }
  iVar3 = 0;
  local_d8 = (Mio_Library_t *)Abc_FrameReadLibGen();
  if (local_d8 == (Mio_Library_t *)0x0) {
    puts("The current library is not available.");
  }
  else {
    lVar5 = 1;
    auVar21 = _DAT_0094e240;
    do {
      if (SUB164(auVar21 ^ _DAT_0094e250,4) == DAT_00990510._4_4_ &&
          SUB164(auVar21 ^ _DAT_0094e250,0) < (int)DAT_00990510) {
        local_d0[lVar5 * 2 + 4] = 0;
        *(undefined4 *)(local_b0 + lVar5 + -1) = 0;
      }
      lVar12 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 2;
      auVar21._8_8_ = lVar12 + 2;
      lVar5 = lVar5 + 2;
    } while (lVar5 != 7);
    uVar11 = 0;
    do {
      lVar5 = 0;
      do {
        if ((uVar11 >> ((uint)lVar5 & 0x1f) & 1) != 0) {
          *(uint *)(local_b0 + lVar5 + -1) = (uint)local_b0[lVar5 + -1] | 1 << ((byte)uVar11 & 0x1f)
          ;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x20);
    lVar5 = 0;
    do {
      *(int *)((long)local_b0 + (lVar5 * 2 + -1) * 4) = (int)local_b0[lVar5 + -1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5);
    local_90 = 0xffffffff00000000;
    ppMVar6 = Mio_CollectRoots(local_d8,6,1e+20,1,(int *)&local_f4,0);
    uVar11 = local_f4;
    lVar5 = (long)(int)local_f4;
    __size = lVar5 * 8;
    __ptr = (long *)malloc(__size);
    pvVar7 = malloc(__size);
    *__ptr = (long)pvVar7;
    if (1 < lVar5) {
      lVar5 = *__ptr;
      lVar12 = 8;
      do {
        *(long *)((long)__ptr + lVar12) = lVar5 + lVar12;
        lVar12 = lVar12 + 8;
      } while (__size - lVar12 != 0);
    }
    if (0 < (int)uVar11) {
      lVar5 = 0;
      do {
        pMVar8 = ppMVar6[lVar5];
        iVar3 = Mio_GateReadPinNum(pMVar8);
        Mio_DeriveTruthTable(pMVar8,(uint (*) [2])&local_b8,iVar3,6,(uint *)__ptr[lVar5]);
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)local_f4);
    }
    local_f0 = ppMVar6;
    Abc_NtkCleanCopy(pNtk);
    pVVar10 = pNtk->vObjs;
    pLib = local_d8;
    if (0 < pVVar10->nSize) {
      lVar5 = 0;
      local_d0[2] = -0x80000000;
      local_d0[3] = 0x80000000;
      local_d0[4] = 0x80000000;
      local_d0[5] = 0x80000000;
      local_e0 = pNtk;
      do {
        uVar11 = local_f4;
        pObj = (Abc_Obj_t *)pVVar10->pArray[lVar5];
        if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
          iVar3 = (pObj->vFanins).nSize;
          if (iVar3 == 1) {
            iVar3 = Abc_SopIsBuf((char *)(pObj->field_5).pData);
            if (iVar3 == 0) {
              pMVar8 = Mio_LibraryReadInv(pLib);
            }
            else {
              pMVar8 = Mio_LibraryReadBuf(pLib);
            }
LAB_002978d7:
            (pObj->field_6).pCopy = (Abc_Obj_t *)pMVar8;
            goto LAB_002978db;
          }
          if (iVar3 == 0) {
            iVar3 = Abc_SopIsConst1((char *)(pObj->field_5).pData);
            if (iVar3 == 0) {
              pMVar8 = Mio_LibraryReadConst0(pLib);
            }
            else {
              pMVar8 = Mio_LibraryReadConst1(pLib);
            }
            goto LAB_002978d7;
          }
          if (6 < iVar3) {
            pcVar18 = Abc_ObjName(pObj);
            __format = "Cannot attach gate with more than 6 inputs to node %s.\n";
            goto LAB_00297a09;
          }
          uVar14 = (ulong)local_f4;
          pSop = (byte *)(pObj->field_5).pData;
          iVar3 = Abc_SopGetVarNum((char *)pSop);
          local_e8 = 0;
          bVar16 = *pSop;
          if (bVar16 != 0) {
            auVar21 = (undefined1  [16])0x0;
            pbVar13 = pSop;
LAB_0029764b:
            auVar24._8_4_ = 0xffffffff;
            auVar24._0_8_ = 0xffffffffffffffff;
            auVar24._12_4_ = 0xffffffff;
            lVar12 = 0;
            do {
              if (bVar16 < 0x31) {
                if (bVar16 == 0x30) {
                  auVar23._8_8_ = 0;
                  auVar23._0_8_ = local_b0[lVar12 + -1];
                  auVar24 = ~auVar23 & auVar24;
                }
                else if ((bVar16 == 0) || (bVar16 == 0x20)) goto LAB_00297690;
              }
              else if (bVar16 == 0x31) {
                auVar25._8_8_ = 0;
                auVar25._0_8_ = local_b0[lVar12 + -1];
                auVar24 = auVar24 & auVar25;
              }
              bVar16 = pbVar13[lVar12 + 1];
              lVar12 = lVar12 + 1;
            } while( true );
          }
          uVar20 = 0;
          uVar15 = 0;
          goto LAB_002976cf;
        }
LAB_002978db:
        lVar5 = lVar5 + 1;
        pVVar10 = pNtk->vObjs;
      } while (lVar5 < pVVar10->nSize);
    }
    if ((void *)*__ptr != (void *)0x0) {
      free((void *)*__ptr);
    }
    free(__ptr);
    if (local_f0 != (Mio_Gate_t **)0x0) {
      free(local_f0);
    }
    if (s_pPerms != (char **)0x0) {
      free(s_pPerms);
      s_pPerms = (char **)0x0;
    }
    pVVar10 = pNtk->vObjs;
    iVar3 = pVVar10->nSize;
    if (0 < (long)iVar3) {
      lVar5 = 0;
      do {
        pvVar7 = pVVar10->pArray[lVar5];
        if (((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xf) == 7)) &&
           (*(long *)((long)pvVar7 + 0x40) == 0)) {
          pcVar18 = 
          "Some elementary gates (constant, buffer, or inverter) are missing in the library.";
          goto LAB_00297a43;
        }
        lVar5 = lVar5 + 1;
      } while (iVar3 != lVar5);
      if (0 < iVar3) {
        lVar5 = 0;
        do {
          pvVar7 = pVVar10->pArray[lVar5];
          if ((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xf) == 7)) {
            *(undefined8 *)((long)pvVar7 + 0x38) = *(undefined8 *)((long)pvVar7 + 0x40);
            *(undefined8 *)((long)pvVar7 + 0x40) = 0;
            pVVar10 = pNtk->vObjs;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < pVVar10->nSize);
      }
    }
    pNtk->ntkFunc = ABC_FUNC_MAP;
    Extra_MmFlexStop((Extra_MmFlex_t *)pNtk->pManFunc);
    pNtk->pManFunc = pLib;
    puts("Library gates are successfully attached to the nodes.");
    iVar4 = Abc_NtkCheck(pNtk);
    iVar3 = 1;
    if (iVar4 == 0) {
      pcVar18 = "Abc_NtkAttach: The network check has failed.";
LAB_00297a43:
      puts(pcVar18);
      iVar3 = 0;
    }
  }
  return iVar3;
LAB_00297690:
  auVar21 = auVar21 | auVar24;
  bVar16 = pbVar13[iVar3 + 3];
  pbVar13 = pbVar13 + (iVar3 + 3);
  if (bVar16 == 0) goto code_r0x002976a0;
  goto LAB_0029764b;
LAB_0029771c:
  uVar9 = uVar9 + 1;
  if (uVar14 == uVar9) goto LAB_00297724;
  goto LAB_0029770a;
code_r0x002976a0:
  local_e8 = auVar21._0_8_;
  uVar15 = auVar21._0_4_;
  uVar20 = auVar21._4_4_;
LAB_002976cf:
  iVar3 = Abc_SopGetPhase((char *)pSop);
  if (iVar3 == 0) {
    uVar15 = ~uVar15;
    uVar20 = ~uVar20;
    local_e8 = CONCAT44(uVar20,uVar15);
  }
  if (0 < (int)uVar11) {
    uVar9 = 0;
LAB_0029770a:
    if ((*(uint *)__ptr[uVar9] != uVar15) || (((uint *)__ptr[uVar9])[1] != uVar20))
    goto LAB_0029771c;
    lVar12 = 0;
    auVar22 = _DAT_0094e240;
    do {
      if (SUB164(auVar22 ^ _DAT_0094e250,4) == local_d0[2] &&
          SUB164(auVar22 ^ _DAT_0094e250,0) < -0x7ffffffa) {
        aiStack_88[lVar12] = (int)lVar12;
        aiStack_88[lVar12 + 1] = (int)lVar12 + 1;
      }
      lVar12 = lVar12 + 2;
      lVar17 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 2;
      auVar22._8_8_ = lVar17 + 2;
    } while (lVar12 != 6);
LAB_00297872:
    pMVar8 = local_f0[uVar9 & 0xffffffff];
    if (pMVar8 != (Mio_Gate_t *)0x0) {
      lVar12 = (long)(pObj->vFanins).nSize;
      pLib = local_d8;
      pNtk = local_e0;
      if (0 < lVar12) {
        piVar1 = (pObj->vFanins).pArray;
        ppvVar2 = pObj->pNtk->vObjs->pArray;
        lVar17 = 0;
        do {
          aiStack_58[lVar17] = *(int *)((long)ppvVar2[piVar1[lVar17]] + 0x10);
          lVar17 = lVar17 + 1;
        } while (lVar12 != lVar17);
        lVar17 = 0;
        do {
          piVar1[aiStack_88[lVar17]] = aiStack_58[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar12 != lVar17);
      }
      goto LAB_002978d7;
    }
    goto LAB_002979fa;
  }
LAB_00297724:
  if (s_pPerms == (char **)0x0) {
    s_pPerms = Extra_Permutations(6);
    s_nPerms = Extra_Factorial(6);
  }
  if (0 < s_nPerms) {
    uVar19 = 0;
    do {
      pcVar18 = s_pPerms[uVar19];
      local_d0[0] = 0;
      local_d0[1] = 0;
      uVar9 = 0;
      do {
        uVar15 = (uint)uVar9;
        if ((*(uint *)((long)&local_e8 + (uVar9 >> 5) * 4) >> (uVar15 & 0x1f) & 1) != 0) {
          lVar12 = 0;
          uVar20 = 0;
          do {
            if ((uVar15 >> ((uint)lVar12 & 0x1f) & 1) != 0) {
              uVar20 = uVar20 | 1 << ((byte)pcVar18[lVar12] & 0x1f);
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 6);
          local_d0[(int)uVar20 >> 5] = local_d0[(int)uVar20 >> 5] | 1 << ((byte)uVar20 & 0x1f);
        }
        uVar9 = (ulong)(uVar15 + 1);
      } while (uVar15 + 1 != 0x40);
      if (0 < (int)uVar11) {
        uVar9 = 0;
        do {
          if ((*(uint *)__ptr[uVar9] == local_d0[0]) && (((uint *)__ptr[uVar9])[1] == local_d0[1]))
          {
            lVar12 = 0;
            do {
              aiStack_88[lVar12] = (int)pcVar18[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 != 6);
            goto LAB_00297872;
          }
          uVar9 = uVar9 + 1;
        } while (uVar14 != uVar9);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != (uint)s_nPerms);
  }
LAB_002979fa:
  pcVar18 = Abc_ObjName(pObj);
  __format = "Could not attach the library gate to node %s.\n";
LAB_00297a09:
  printf(__format,pcVar18);
  if ((void *)*__ptr != (void *)0x0) {
    free((void *)*__ptr);
  }
  free(__ptr);
  if (local_f0 == (Mio_Gate_t **)0x0) {
    return 0;
  }
  free(local_f0);
  return 0;
}

Assistant:

int Abc_NtkAttach( Abc_Ntk_t * pNtk )
{
    Mio_Library_t * pGenlib;
    unsigned ** puTruthGates;
    unsigned uTruths[6][2];
    Abc_Obj_t * pNode;
    Mio_Gate_t ** ppGates;
    int nGates, nFanins, i;

    assert( Abc_NtkIsSopLogic(pNtk) );

    // check that the library is available
    pGenlib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if ( pGenlib == NULL )
    {
        printf( "The current library is not available.\n" );
        return 0;
    }

    // start the truth tables
    Abc_AttachSetupTruthTables( uTruths );
    
    // collect all the gates
    ppGates = Mio_CollectRoots( pGenlib, 6, (float)1.0e+20, 1, &nGates, 0 );

    // derive the gate truth tables
    puTruthGates    = ABC_ALLOC( unsigned *, nGates );
    puTruthGates[0] = ABC_ALLOC( unsigned, 2 * nGates );
    for ( i = 1; i < nGates; i++ )
        puTruthGates[i] = puTruthGates[i-1] + 2;
    for ( i = 0; i < nGates; i++ )
        Mio_DeriveTruthTable( ppGates[i], uTruths, Mio_GateReadPinNum(ppGates[i]), 6, puTruthGates[i] );

    // assign the gates to pNode->pCopy
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        nFanins = Abc_ObjFaninNum(pNode);
        if ( nFanins == 0 )
        {
            if ( Abc_SopIsConst1((char *)pNode->pData) )
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadConst1(pGenlib);
            else
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadConst0(pGenlib);
        }
        else if ( nFanins == 1 )
        {
            if ( Abc_SopIsBuf((char *)pNode->pData) )
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadBuf(pGenlib);
            else
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadInv(pGenlib);
        }
        else if ( nFanins > 6 )
        {
            printf( "Cannot attach gate with more than 6 inputs to node %s.\n", Abc_ObjName(pNode) );
            ABC_FREE( puTruthGates[0] );
            ABC_FREE( puTruthGates );
            ABC_FREE( ppGates );
            return 0;
        }
        else if ( !Abc_NodeAttach( pNode, ppGates, puTruthGates, nGates, uTruths ) )
        {
            printf( "Could not attach the library gate to node %s.\n", Abc_ObjName(pNode) );
            ABC_FREE( puTruthGates[0] );
            ABC_FREE( puTruthGates );
            ABC_FREE( ppGates );
            return 0;
        }
    }
    ABC_FREE( puTruthGates[0] );
    ABC_FREE( puTruthGates );
    ABC_FREE( ppGates );
    ABC_FREE( s_pPerms );

    // perform the final transformation
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pNode->pCopy == NULL )
        {
            printf( "Some elementary gates (constant, buffer, or inverter) are missing in the library.\n" );
            return 0;
        }
    }

    // replace SOP representation by the gate representation
    Abc_NtkForEachNode( pNtk, pNode, i )
        pNode->pData = pNode->pCopy, pNode->pCopy = NULL;
    pNtk->ntkFunc = ABC_FUNC_MAP;
    Extra_MmFlexStop( (Extra_MmFlex_t *)pNtk->pManFunc );
    pNtk->pManFunc = pGenlib;

    printf( "Library gates are successfully attached to the nodes.\n" );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkAttach: The network check has failed.\n" );
        return 0;
    }
    return 1;
}